

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

int __thiscall
anon_unknown.dwarf_3f9603::NumberTreeDetails::compareKeys
          (NumberTreeDetails *this,QPDFObjectHandle *a,QPDFObjectHandle *b)

{
  char cVar1;
  uint uVar2;
  longlong lVar3;
  longlong lVar4;
  logic_error *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)a);
  cVar1 = (**(code **)((long)*this + 8))(this,&_Stack_48);
  if (cVar1 == '\0') {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)b);
    cVar1 = (**(code **)((long)*this + 8))(this,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    if (cVar1 != '\0') {
      lVar3 = QPDFObjectHandle::getIntValue(a);
      lVar4 = QPDFObjectHandle::getIntValue(b);
      uVar2 = 0xffffffff;
      if (lVar4 <= lVar3) {
        uVar2 = (uint)(lVar4 < lVar3);
      }
      return uVar2;
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"comparing invalid keys");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int
        compareKeys(QPDFObjectHandle a, QPDFObjectHandle b) const override
        {
            if (!(keyValid(a) && keyValid(b))) {
                // We don't call this without calling keyValid first
                throw std::logic_error("comparing invalid keys");
            }
            auto as = a.getIntValue();
            auto bs = b.getIntValue();
            return ((as < bs) ? -1 : (as > bs) ? 1 : 0);
        }